

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satStore.c
# Opt level: O2

char * Sto_ManMemoryFetch(Sto_Man_t *p,int nBytes)

{
  long *plVar1;
  long *plVar2;
  int iVar3;
  
  plVar1 = (long *)p->pChunkLast;
  if ((plVar1 == (long *)0x0) ||
     (iVar3 = p->nChunkUsed, plVar2 = plVar1, p->nChunkSize - iVar3 < nBytes)) {
    plVar2 = (long *)malloc((long)p->nChunkSize);
    *plVar2 = (long)plVar1;
    p->pChunkLast = (char *)plVar2;
    iVar3 = 8;
  }
  p->nChunkUsed = iVar3 + nBytes;
  return (char *)((long)plVar2 + (long)iVar3);
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Fetches memory.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
char * Sto_ManMemoryFetch( Sto_Man_t * p, int nBytes )
{
    char * pMem;
    if ( p->pChunkLast == NULL || nBytes > p->nChunkSize - p->nChunkUsed )
    {
        pMem = (char *)ABC_ALLOC( char, p->nChunkSize );
        *(char **)pMem = p->pChunkLast;
        p->pChunkLast = pMem;
        p->nChunkUsed = sizeof(char *);
    }
    pMem = p->pChunkLast + p->nChunkUsed;
    p->nChunkUsed += nBytes;
    return pMem;
}